

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

Vector2f __thiscall
sf::RenderTarget::mapPixelToCoords(RenderTarget *this,Vector2i *point,View *view)

{
  int *in_RSI;
  View *in_RDI;
  Vector2f VVar1;
  FloatRect viewport;
  Vector2f normalized;
  IntRect local_48;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  Vector2<float> local_28 [2];
  int *local_18;
  View *this_00;
  
  local_18 = in_RSI;
  this_00 = in_RDI;
  Vector2<float>::Vector2(local_28);
  local_48 = getViewport((RenderTarget *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (View *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  Rect<float>::Rect<int>((Rect<float> *)&stack0xffffffffffffffc8,&local_48);
  local_28[0].x =
       (((float)*local_18 - in_stack_ffffffffffffffc8) +
       ((float)*local_18 - in_stack_ffffffffffffffc8)) / in_stack_ffffffffffffffd0 + -1.0;
  local_28[0].y =
       1.0 - (((float)local_18[1] - in_stack_ffffffffffffffcc) +
             ((float)local_18[1] - in_stack_ffffffffffffffcc)) / in_stack_ffffffffffffffd4;
  View::getInverseTransform(this_00);
  VVar1 = Transform::transformPoint((Transform *)in_RDI,(Vector2f *)0x20c690);
  return VVar1;
}

Assistant:

Vector2f RenderTarget::mapPixelToCoords(const Vector2i& point, const View& view) const
{
    // First, convert from viewport coordinates to homogeneous coordinates
    Vector2f normalized;
    FloatRect viewport = FloatRect(getViewport(view));
    normalized.x = -1.f + 2.f * (static_cast<float>(point.x) - viewport.left) / viewport.width;
    normalized.y =  1.f - 2.f * (static_cast<float>(point.y) - viewport.top)  / viewport.height;

    // Then transform by the inverse of the view matrix
    return view.getInverseTransform().transformPoint(normalized);
}